

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu-exec.c
# Opt level: O2

tcg_target_ulong cpu_tb_exec(CPUState *cpu,TranslationBlock *itb)

{
  uint uVar1;
  void *pvVar2;
  undefined8 uVar3;
  _func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *p_Var4;
  _func_void_CPUState_ptr_vaddr_conflict *p_Var5;
  ulong uVar6;
  
  pvVar2 = cpu->env_ptr;
  uVar3._0_4_ = itb->cflags;
  uVar3._4_4_ = itb->trace_vcpu_dstate;
  tb_exec_lock_tricore((TCGContext_conflict9 *)cpu->uc->tcg_ctx);
  uVar6 = (**(code **)(*(long *)(*(long *)((long)pvVar2 + 0x2c8) + 0x2e8) + 0x90))(pvVar2,uVar3);
  if (cpu->uc->nested_level == 1) {
    tb_exec_unlock_tricore((TCGContext_conflict9 *)cpu->uc->tcg_ctx);
  }
  cpu->can_do_io = 1;
  if ((uVar6 & 2) != 0) {
    if (*(long *)(*(long *)((long)pvVar2 + 0x2c8) + 0x358) == 0) {
      uVar1 = *(uint *)(*(long *)((long)pvVar2 + 0x2c8) + 0x578);
      if (((0x12 < uVar1) || ((0x771c0U >> (uVar1 & 0x1f) & 1) == 0)) &&
         (cpu->uc->quit_request == false)) {
        p_Var4 = cpu->cc->synchronize_from_tb;
        if (p_Var4 == (_func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *)0x0) {
          p_Var5 = cpu->cc->set_pc;
          if (p_Var5 == (_func_void_CPUState_ptr_vaddr_conflict *)0x0) {
            __assert_fail("cc->set_pc",
                          "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cpu-exec.c"
                          ,0x61,"tcg_target_ulong cpu_tb_exec(CPUState *, TranslationBlock *)");
          }
          (*p_Var5)((CPUState_conflict *)cpu,
                    (vaddr)((TranslationBlock_conflict *)(uVar6 & 0xfffffffffffffffc))->pc);
        }
        else {
          (*p_Var4)((CPUState_conflict *)cpu,
                    (TranslationBlock_conflict *)(uVar6 & 0xfffffffffffffffc));
        }
      }
    }
    cpu->tcg_exit_req = 0;
  }
  return uVar6;
}

Assistant:

static inline tcg_target_ulong cpu_tb_exec(CPUState *cpu, TranslationBlock *itb)
{
    CPUArchState *env = cpu->env_ptr;
    uintptr_t ret;
    TranslationBlock *last_tb;
    int tb_exit;
    uint8_t *tb_ptr = itb->tc.ptr;

    UC_TRACE_START(UC_TRACE_TB_EXEC);
    tb_exec_lock(cpu->uc->tcg_ctx);
    ret = tcg_qemu_tb_exec(env, tb_ptr);
    if (cpu->uc->nested_level == 1) {
        // Only unlock (allow writing to JIT area) if we are the outmost uc_emu_start
        tb_exec_unlock(cpu->uc->tcg_ctx);
    }
    UC_TRACE_END(UC_TRACE_TB_EXEC, "[uc] exec tb 0x%" PRIx64 ": ", itb->pc);

    cpu->can_do_io = 1;
    last_tb = (TranslationBlock *)(ret & ~TB_EXIT_MASK);
    tb_exit = ret & TB_EXIT_MASK;
    // trace_exec_tb_exit(last_tb, tb_exit);

    if (tb_exit > TB_EXIT_IDX1) {
        /* We didn't start executing this TB (eg because the instruction
         * counter hit zero); we must restore the guest PC to the address
         * of the start of the TB.
         */
        CPUClass *cc = CPU_GET_CLASS(cpu);
        if (!HOOK_EXISTS(env->uc, UC_HOOK_CODE)) {
            // We should sync pc for R/W error.
            switch (env->uc->invalid_error) {
                case UC_ERR_WRITE_PROT:
                case UC_ERR_READ_PROT:
                case UC_ERR_FETCH_PROT:
                case UC_ERR_WRITE_UNMAPPED:
                case UC_ERR_READ_UNMAPPED:
                case UC_ERR_FETCH_UNMAPPED:
                case UC_ERR_WRITE_UNALIGNED:
                case UC_ERR_READ_UNALIGNED:
                case UC_ERR_FETCH_UNALIGNED:
                    break;
                default:
                    // If we receive a quit request, users has sync-ed PC themselves.
                    if (!cpu->uc->quit_request) {
                        if (cc->synchronize_from_tb) {
                            cc->synchronize_from_tb(cpu, last_tb);
                        } else {
                            assert(cc->set_pc);
                            cc->set_pc(cpu, last_tb->pc);
                        }
                    }
            }
        }

        cpu->tcg_exit_req = 0;
    }
    return ret;
}